

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  float fVar2;
  float fVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  float fVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  undefined4 uVar14;
  long lVar15;
  size_t *psVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 extraout_var [56];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  undefined1 auVar33 [16];
  float fVar38;
  undefined1 auVar37 [16];
  float fVar40;
  undefined1 auVar39 [16];
  float fVar41;
  float fVar42;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar51;
  float fVar52;
  undefined1 auVar50 [16];
  float fVar53;
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar69;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar66;
  float fVar68;
  undefined1 auVar67 [64];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar54._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar54._8_56_ = extraout_var;
  auVar24._8_8_ = 0;
  auVar24._0_4_ = time_range->lower;
  auVar24._4_4_ = time_range->upper;
  auVar23 = auVar54._0_16_;
  auVar44 = vcmpps_avx(auVar23,auVar24,1);
  auVar7 = vblendps_avx(auVar24,auVar23,2);
  auVar23 = vinsertps_avx(auVar23,auVar24,0x50);
  auVar7 = vblendvps_avx(auVar23,auVar7,auVar44);
  auVar44 = vmovshdup_avx(auVar7);
  fVar49 = auVar44._0_4_;
  if (auVar7._0_4_ <= fVar49) {
    uVar13 = r->_begin;
    uVar19 = r->_end;
    if (uVar13 < uVar19) {
      auVar44._8_4_ = 0xff800000;
      auVar44._0_8_ = 0xff800000ff800000;
      auVar44._12_4_ = 0xff800000;
      auVar54 = ZEXT1664(auVar44);
      auVar23._8_4_ = 0x7f800000;
      auVar23._0_8_ = 0x7f8000007f800000;
      auVar23._12_4_ = 0x7f800000;
      auVar59 = ZEXT1664(auVar23);
      sVar12 = 0;
      auVar62 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar67 = ZEXT1664(auVar23);
      auVar58 = ZEXT1664(auVar44);
      do {
        BVar4 = (this->super_Points).super_Geometry.time_range;
        auVar32._8_8_ = 0;
        auVar32._0_4_ = BVar4.lower;
        auVar32._4_4_ = BVar4.upper;
        auVar44 = vmovshdup_avx(auVar32);
        fVar30 = BVar4.lower;
        fVar10 = auVar44._0_4_ - fVar30;
        pBVar5 = (this->super_Points).vertices.items;
        if ((uVar13 & 0xffffffff) < (pBVar5->super_RawBufferView).num) {
          fVar1 = (this->super_Points).super_Geometry.fnumTimeSegments;
          auVar23 = ZEXT416((uint)(fVar1 * ((fVar49 - fVar30) / fVar10) * 0.99999976));
          auVar23 = vroundss_avx(auVar23,auVar23,10);
          auVar24 = vminss_avx(auVar23,ZEXT416((uint)fVar1));
          fVar61 = auVar7._0_4_ - fVar30;
          auVar23 = ZEXT416((uint)(fVar1 * (fVar61 / fVar10) * 1.0000002));
          auVar23 = vroundss_avx(auVar23,auVar23,9);
          auVar23 = vmaxss_avx(auVar62._0_16_,auVar23);
          if ((uint)(int)auVar23._0_4_ <= (uint)(int)auVar24._0_4_) {
            uVar20 = (ulong)(int)auVar23._0_4_;
            psVar16 = &pBVar5[uVar20].super_RawBufferView.stride;
            do {
              lVar15 = *psVar16 * (uVar13 & 0xffffffff);
              if (*(float *)(((RawBufferView *)(psVar16 + -2))->ptr_ofs + lVar15 + 0xc) < 0.0)
              goto LAB_01250ea0;
              auVar23 = *(undefined1 (*) [16])(((RawBufferView *)(psVar16 + -2))->ptr_ofs + lVar15);
              auVar43._8_4_ = 0xddccb9a2;
              auVar43._0_8_ = 0xddccb9a2ddccb9a2;
              auVar43._12_4_ = 0xddccb9a2;
              auVar32 = vcmpps_avx(auVar23,auVar43,2);
              auVar55._8_4_ = 0x5dccb9a2;
              auVar55._0_8_ = 0x5dccb9a25dccb9a2;
              auVar55._12_4_ = 0x5dccb9a2;
              auVar23 = vcmpps_avx(auVar23,auVar55,5);
              auVar23 = vorps_avx(auVar32,auVar23);
              uVar14 = vmovmskps_avx(auVar23);
              if ((char)uVar14 != '\0') goto LAB_01250ea0;
              uVar20 = uVar20 + 1;
              psVar16 = psVar16 + 7;
            } while (uVar20 <= (ulong)(long)(int)auVar24._0_4_);
          }
          fVar27 = auVar44._0_4_ - fVar30;
          fVar61 = fVar61 / fVar27;
          fVar27 = (fVar49 - fVar30) / fVar27;
          fVar10 = fVar1 * fVar61;
          fVar30 = fVar1 * fVar27;
          auVar24 = vroundss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),9);
          auVar32 = vroundss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),10);
          auVar44 = vmaxss_avx(auVar24,auVar62._0_16_);
          auVar23 = vminss_avx(auVar32,ZEXT416((uint)fVar1));
          fVar40 = auVar23._0_4_;
          iVar17 = (int)auVar24._0_4_;
          if (iVar17 < 0) {
            iVar17 = -1;
          }
          uVar11 = (int)fVar1 + 1U;
          if ((int)auVar32._0_4_ < (int)((int)fVar1 + 1U)) {
            uVar11 = (int)auVar32._0_4_;
          }
          lVar15 = (long)(int)auVar44._0_4_;
          pcVar6 = pBVar5[lVar15].super_RawBufferView.ptr_ofs;
          lVar21 = pBVar5[lVar15].super_RawBufferView.stride * uVar13;
          auVar23 = *(undefined1 (*) [16])(pcVar6 + lVar21);
          fVar2 = (this->super_Points).maxRadiusScale;
          auVar24 = ZEXT416((uint)(fVar2 * *(float *)(pcVar6 + lVar21 + 0xc)));
          auVar24 = vshufps_avx(auVar24,auVar24,0);
          auVar32 = vsubps_avx(auVar23,auVar24);
          fVar42 = auVar23._0_4_ + auVar24._0_4_;
          fVar46 = auVar23._4_4_ + auVar24._4_4_;
          fVar47 = auVar23._8_4_ + auVar24._8_4_;
          fVar48 = auVar23._12_4_ + auVar24._12_4_;
          lVar21 = (long)(int)fVar40;
          pcVar6 = pBVar5[lVar21].super_RawBufferView.ptr_ofs;
          lVar22 = pBVar5[lVar21].super_RawBufferView.stride * uVar13;
          auVar23 = *(undefined1 (*) [16])(pcVar6 + lVar22);
          auVar24 = ZEXT416((uint)(fVar2 * *(float *)(pcVar6 + lVar22 + 0xc)));
          auVar24 = vshufps_avx(auVar24,auVar24,0);
          auVar43 = vsubps_avx(auVar23,auVar24);
          fVar31 = auVar23._0_4_ + auVar24._0_4_;
          fVar34 = auVar23._4_4_ + auVar24._4_4_;
          fVar35 = auVar23._8_4_ + auVar24._8_4_;
          fVar36 = auVar23._12_4_ + auVar24._12_4_;
          auVar44 = ZEXT416((uint)(fVar10 - auVar44._0_4_));
          fVar68 = auVar43._0_4_;
          fVar69 = auVar43._4_4_;
          fVar38 = auVar43._8_4_;
          fVar10 = auVar43._12_4_;
          fVar41 = auVar32._0_4_;
          fVar51 = auVar32._4_4_;
          fVar52 = auVar32._8_4_;
          fVar53 = auVar32._12_4_;
          if (uVar11 - iVar17 == 1) {
            auVar44 = vmaxss_avx(auVar44,ZEXT816(0) << 0x40);
            auVar23 = vshufps_avx(auVar44,auVar44,0);
            auVar44 = ZEXT416((uint)(1.0 - auVar44._0_4_));
            auVar44 = vshufps_avx(auVar44,auVar44,0);
            auVar63._0_4_ = auVar23._0_4_ * fVar68 + fVar41 * auVar44._0_4_;
            auVar63._4_4_ = auVar23._4_4_ * fVar69 + fVar51 * auVar44._4_4_;
            auVar63._8_4_ = auVar23._8_4_ * fVar38 + fVar52 * auVar44._8_4_;
            auVar63._12_4_ = auVar23._12_4_ * fVar10 + fVar53 * auVar44._12_4_;
            auVar39._0_4_ = auVar23._0_4_ * fVar31 + fVar42 * auVar44._0_4_;
            auVar39._4_4_ = auVar23._4_4_ * fVar34 + fVar46 * auVar44._4_4_;
            auVar39._8_4_ = auVar23._8_4_ * fVar35 + fVar47 * auVar44._8_4_;
            auVar39._12_4_ = auVar23._12_4_ * fVar36 + fVar48 * auVar44._12_4_;
            auVar44 = vmaxss_avx(ZEXT416((uint)(fVar40 - fVar30)),ZEXT816(0) << 0x40);
            auVar23 = vshufps_avx(auVar44,auVar44,0);
            auVar44 = ZEXT416((uint)(1.0 - auVar44._0_4_));
            auVar44 = vshufps_avx(auVar44,auVar44,0);
            auVar60._0_4_ = fVar41 * auVar23._0_4_ + fVar68 * auVar44._0_4_;
            auVar60._4_4_ = fVar51 * auVar23._4_4_ + fVar69 * auVar44._4_4_;
            auVar60._8_4_ = fVar52 * auVar23._8_4_ + fVar38 * auVar44._8_4_;
            auVar60._12_4_ = fVar53 * auVar23._12_4_ + fVar10 * auVar44._12_4_;
            auVar50._0_4_ = fVar42 * auVar23._0_4_ + fVar31 * auVar44._0_4_;
            auVar50._4_4_ = fVar46 * auVar23._4_4_ + fVar34 * auVar44._4_4_;
            auVar50._8_4_ = fVar47 * auVar23._8_4_ + fVar35 * auVar44._8_4_;
            auVar50._12_4_ = fVar48 * auVar23._12_4_ + fVar36 * auVar44._12_4_;
          }
          else {
            pcVar6 = pBVar5[lVar15 + 1].super_RawBufferView.ptr_ofs;
            lVar15 = pBVar5[lVar15 + 1].super_RawBufferView.stride * uVar13;
            auVar23 = *(undefined1 (*) [16])(pcVar6 + lVar15);
            fVar3 = *(float *)(pcVar6 + lVar15 + 0xc);
            auVar64._0_4_ = fVar2 * fVar3;
            auVar64._4_4_ = fVar2 * fVar3;
            auVar64._8_4_ = fVar2 * fVar3;
            auVar64._12_4_ = fVar2 * fVar3;
            auVar43 = vsubps_avx(auVar23,auVar64);
            pcVar6 = pBVar5[lVar21 + -1].super_RawBufferView.ptr_ofs;
            lVar15 = pBVar5[lVar21 + -1].super_RawBufferView.stride * uVar13;
            auVar24 = *(undefined1 (*) [16])(pcVar6 + lVar15);
            fVar3 = *(float *)(pcVar6 + lVar15 + 0xc);
            auVar28._0_4_ = fVar2 * fVar3;
            auVar28._4_4_ = fVar2 * fVar3;
            auVar28._8_4_ = fVar2 * fVar3;
            auVar28._12_4_ = fVar2 * fVar3;
            auVar55 = vsubps_avx(auVar24,auVar28);
            auVar44 = vmaxss_avx(auVar44,ZEXT816(0) << 0x40);
            auVar32 = vshufps_avx(auVar44,auVar44,0);
            auVar44 = ZEXT416((uint)(1.0 - auVar44._0_4_));
            auVar44 = vshufps_avx(auVar44,auVar44,0);
            auVar63._0_4_ = auVar43._0_4_ * auVar32._0_4_ + auVar44._0_4_ * fVar41;
            auVar63._4_4_ = auVar43._4_4_ * auVar32._4_4_ + auVar44._4_4_ * fVar51;
            auVar63._8_4_ = auVar43._8_4_ * auVar32._8_4_ + auVar44._8_4_ * fVar52;
            auVar63._12_4_ = auVar43._12_4_ * auVar32._12_4_ + auVar44._12_4_ * fVar53;
            auVar39._0_4_ = auVar44._0_4_ * fVar42 + auVar32._0_4_ * (auVar64._0_4_ + auVar23._0_4_)
            ;
            auVar39._4_4_ = auVar44._4_4_ * fVar46 + auVar32._4_4_ * (auVar64._4_4_ + auVar23._4_4_)
            ;
            auVar39._8_4_ = auVar44._8_4_ * fVar47 + auVar32._8_4_ * (auVar64._8_4_ + auVar23._8_4_)
            ;
            auVar39._12_4_ =
                 auVar44._12_4_ * fVar48 + auVar32._12_4_ * (auVar64._12_4_ + auVar23._12_4_);
            auVar44 = vmaxss_avx(ZEXT416((uint)(fVar40 - fVar30)),ZEXT416(0));
            auVar23 = vshufps_avx(auVar44,auVar44,0);
            auVar44 = ZEXT416((uint)(1.0 - auVar44._0_4_));
            auVar44 = vshufps_avx(auVar44,auVar44,0);
            auVar60._0_4_ = fVar68 * auVar44._0_4_ + auVar55._0_4_ * auVar23._0_4_;
            auVar60._4_4_ = fVar69 * auVar44._4_4_ + auVar55._4_4_ * auVar23._4_4_;
            auVar60._8_4_ = fVar38 * auVar44._8_4_ + auVar55._8_4_ * auVar23._8_4_;
            auVar60._12_4_ = fVar10 * auVar44._12_4_ + auVar55._12_4_ * auVar23._12_4_;
            auVar50._0_4_ = fVar31 * auVar44._0_4_ + auVar23._0_4_ * (auVar24._0_4_ + auVar28._0_4_)
            ;
            auVar50._4_4_ = fVar34 * auVar44._4_4_ + auVar23._4_4_ * (auVar24._4_4_ + auVar28._4_4_)
            ;
            auVar50._8_4_ = fVar35 * auVar44._8_4_ + auVar23._8_4_ * (auVar24._8_4_ + auVar28._8_4_)
            ;
            auVar50._12_4_ =
                 fVar36 * auVar44._12_4_ + auVar23._12_4_ * (auVar24._12_4_ + auVar28._12_4_);
            uVar18 = iVar17 + 1;
            if ((int)uVar18 < (int)uVar11) {
              psVar16 = &pBVar5[uVar18].super_RawBufferView.stride;
              do {
                auVar25._0_4_ = ((float)(int)uVar18 / fVar1 - fVar61) / (fVar27 - fVar61);
                auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar44 = vshufps_avx(auVar25,auVar25,0);
                fVar31 = auVar60._4_4_;
                fVar34 = auVar60._8_4_;
                fVar35 = auVar60._12_4_;
                auVar23 = vshufps_avx(ZEXT416((uint)(1.0 - auVar25._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar25._0_4_)),0);
                fVar36 = auVar63._4_4_;
                fVar68 = auVar63._8_4_;
                fVar69 = auVar63._12_4_;
                auVar37._0_4_ = auVar60._0_4_ * auVar44._0_4_ + auVar63._0_4_ * auVar23._0_4_;
                auVar37._4_4_ = fVar31 * auVar44._4_4_ + fVar36 * auVar23._4_4_;
                auVar37._8_4_ = fVar34 * auVar44._8_4_ + fVar68 * auVar23._8_4_;
                auVar37._12_4_ = fVar35 * auVar44._12_4_ + fVar69 * auVar23._12_4_;
                fVar51 = auVar50._4_4_;
                fVar52 = auVar50._8_4_;
                fVar53 = auVar50._12_4_;
                fVar30 = auVar39._4_4_;
                fVar40 = auVar39._8_4_;
                fVar41 = auVar39._12_4_;
                auVar26._0_4_ = auVar50._0_4_ * auVar44._0_4_ + auVar39._0_4_ * auVar23._0_4_;
                auVar26._4_4_ = fVar51 * auVar44._4_4_ + fVar30 * auVar23._4_4_;
                auVar26._8_4_ = fVar52 * auVar44._8_4_ + fVar40 * auVar23._8_4_;
                auVar26._12_4_ = fVar53 * auVar44._12_4_ + fVar41 * auVar23._12_4_;
                auVar44 = *(undefined1 (*) [16])
                           (((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar13);
                fVar10 = *(float *)(((RawBufferView *)(psVar16 + -2))->ptr_ofs +
                                   *psVar16 * uVar13 + 0xc);
                auVar45._0_4_ = fVar2 * fVar10;
                auVar45._4_4_ = fVar2 * fVar10;
                auVar45._8_4_ = fVar2 * fVar10;
                auVar45._12_4_ = fVar2 * fVar10;
                auVar23 = vsubps_avx(auVar44,auVar45);
                auVar23 = vsubps_avx(auVar23,auVar37);
                auVar29._0_4_ = auVar44._0_4_ + auVar45._0_4_;
                auVar29._4_4_ = auVar44._4_4_ + auVar45._4_4_;
                auVar29._8_4_ = auVar44._8_4_ + auVar45._8_4_;
                auVar29._12_4_ = auVar44._12_4_ + auVar45._12_4_;
                auVar44 = vsubps_avx(auVar29,auVar26);
                auVar23 = vminps_avx(auVar23,ZEXT416(0) << 0x20);
                auVar44 = vmaxps_avx(auVar44,ZEXT416(0) << 0x20);
                auVar63._0_4_ = auVar63._0_4_ + auVar23._0_4_;
                auVar63._4_4_ = fVar36 + auVar23._4_4_;
                auVar63._8_4_ = fVar68 + auVar23._8_4_;
                auVar63._12_4_ = fVar69 + auVar23._12_4_;
                auVar60._0_4_ = auVar60._0_4_ + auVar23._0_4_;
                auVar60._4_4_ = fVar31 + auVar23._4_4_;
                auVar60._8_4_ = fVar34 + auVar23._8_4_;
                auVar60._12_4_ = fVar35 + auVar23._12_4_;
                auVar39._0_4_ = auVar39._0_4_ + auVar44._0_4_;
                auVar39._4_4_ = fVar30 + auVar44._4_4_;
                auVar39._8_4_ = fVar40 + auVar44._8_4_;
                auVar39._12_4_ = fVar41 + auVar44._12_4_;
                auVar50._0_4_ = auVar50._0_4_ + auVar44._0_4_;
                auVar50._4_4_ = fVar51 + auVar44._4_4_;
                auVar50._8_4_ = fVar52 + auVar44._8_4_;
                auVar50._12_4_ = fVar53 + auVar44._12_4_;
                uVar18 = uVar18 + 1;
                psVar16 = psVar16 + 7;
              } while (uVar11 != uVar18);
            }
          }
          auVar44 = vmaxps_avx(auVar39,auVar50);
          auVar23 = vminps_avx(auVar63,auVar60);
          aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar23,ZEXT416(geomID),0x30);
          aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar44,ZEXT416((uint)uVar13),0x30);
          auVar44 = vminps_avx(auVar59._0_16_,(undefined1  [16])aVar8);
          auVar59 = ZEXT1664(auVar44);
          auVar44 = vmaxps_avx(auVar54._0_16_,(undefined1  [16])aVar9);
          auVar54 = ZEXT1664(auVar44);
          auVar33._0_4_ = aVar8.x + aVar9.x;
          auVar33._4_4_ = aVar8.y + aVar9.y;
          auVar33._8_4_ = aVar8.z + aVar9.z;
          auVar33._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
          auVar44 = vminps_avx(auVar67._0_16_,auVar33);
          auVar67 = ZEXT1664(auVar44);
          auVar44 = vmaxps_avx(auVar58._0_16_,auVar33);
          auVar58 = ZEXT1664(auVar44);
          sVar12 = sVar12 + 1;
          prims[k].lower.field_0.field_1 = aVar8;
          prims[k].upper.field_0.field_1 = aVar9;
          uVar19 = r->_end;
          auVar62 = ZEXT464(0) << 0x20;
          k = k + 1;
        }
LAB_01250ea0:
        aVar56 = auVar58._0_16_;
        aVar65 = auVar67._0_16_;
        aVar57 = auVar54._0_16_;
        aVar66 = auVar59._0_16_;
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar19);
    }
    else {
      sVar12 = 0;
      aVar57.m128[2] = -INFINITY;
      aVar57._0_8_ = 0xff800000ff800000;
      aVar57.m128[3] = -INFINITY;
      aVar66.m128[2] = INFINITY;
      aVar66._0_8_ = 0x7f8000007f800000;
      aVar66.m128[3] = INFINITY;
      aVar65 = aVar66;
      aVar56 = aVar57;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar66;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar57;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar65;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar56;
    __return_storage_ptr__->end = sVar12;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }